

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iptables_ext.c
# Opt level: O3

int parse_tcp(void *data,char **str,int inv)

{
  uint8_t uVar1;
  int iVar2;
  char *str_00;
  char *pcVar3;
  byte bVar4;
  double __x;
  double __x_00;
  
  pcVar3 = *str;
  str_00 = strtok((char *)0x0," \t\n");
  if (str_00 == (char *)0x0) {
    _log(__x);
LAB_00104d08:
    iVar2 = -1;
  }
  else {
    iVar2 = strcmp(pcVar3,"--sport");
    if (iVar2 == 0) {
      iVar2 = parse_port(str_00,(uint16_t *)data);
      if (iVar2 != 0) {
        return -1;
      }
      bVar4 = 1;
    }
    else {
      iVar2 = strcmp(pcVar3,"--dport");
      if (iVar2 == 0) {
        iVar2 = parse_port(str_00,(uint16_t *)((long)data + 4));
        if (iVar2 != 0) {
          return -1;
        }
        bVar4 = 2;
      }
      else {
        iVar2 = strcmp(pcVar3,"--tcp-flags");
        if (iVar2 != 0) {
          return 0;
        }
        pcVar3 = strtok((char *)0x0," \t\n");
        if (pcVar3 == (char *)0x0) {
          _log(__x_00);
          goto LAB_00104d08;
        }
        uVar1 = parse_tcp_flag(pcVar3);
        *(uint8_t *)((long)data + 9) = uVar1;
        uVar1 = parse_tcp_flag(str_00);
        *(uint8_t *)((long)data + 10) = uVar1;
        bVar4 = 8;
      }
    }
    iVar2 = 0;
    if (inv != 0) {
      *(byte *)((long)data + 0xb) = *(byte *)((long)data + 0xb) | bVar4;
    }
  }
  return iVar2;
}

Assistant:

static int parse_tcp(void *data, char **str, int inv)
{
	match_tcp_t *m = (match_tcp_t *)data;
	int inv_type = 0;
	char *p = *str;
	char *q = p;
	char *r = NULL;
	q = strtok(NULL, " \t\n");

	if (q == NULL) {
		log_err("opt \"%s\" arg is null", p);
		goto err;
	}

	if (strcmp(p, "--sport") == 0) {
		if (parse_port(q, m->src) != 0) {
			goto err;
		}

		inv_type = INV_TCP_SRC;
	} else if (strcmp(p, "--dport") == 0) {
		if (parse_port(q, m->dst) != 0) {
			goto err;
		}

		inv_type = INV_TCP_DST;
	} else if (strcmp(p, "--tcp-flags") == 0) {
		r = strtok(NULL, " \t\n");

		if (r == NULL) {
			log_err("opt --tcp-flags requires two args\n");
			goto err;
		}

		m->flag = parse_tcp_flag(r);
		m->flag_mask = parse_tcp_flag(q);
		q = r;
		inv_type = INV_TCP_FLAG;
	} else if (strcmp(p, "--tcp-option") == 0) {
		//TODO:
	}

	if (inv && inv_type) {
		m->invert |= inv_type;
	}

	p = q;
	return 0;
err:
	return -1;
}